

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O0

int day2b::get_bathroom_code(string *input)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  int base;
  char *local_1d8;
  char *p;
  int local_1c0;
  uint local_1bc;
  int i;
  int code;
  Position position;
  string line;
  istringstream stream;
  string *input_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)input,_S_in);
  std::__cxx11::string::string((string *)&position);
  _i = 0x200000000;
  local_1bc = 0;
  local_1c0 = 1;
  while( true ) {
    piVar3 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)&position);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    local_1d8 = (char *)std::__cxx11::string::c_str();
    while( true ) {
      if (*local_1d8 == '\0') break;
      switch(*local_1d8) {
      case 'D':
        bVar1 = is_valid(i,code + 1);
        if (bVar1) {
          _i = CONCAT44(code + 1,i);
        }
        break;
      case 'L':
        bVar1 = is_valid(i + -1,code);
        if (bVar1) {
          _i = CONCAT44(code,i + -1);
        }
        break;
      case 'R':
        bVar1 = is_valid(i + 1,code);
        if (bVar1) {
          _i = CONCAT44(code,i + 1);
        }
        break;
      case 'U':
        bVar1 = is_valid(i,code + -1);
        if (bVar1) {
          _i = CONCAT44(code + -1,i);
        }
      }
      local_1d8 = local_1d8 + 1;
    }
    local_1bc = (char)keypad[i + code * 5] * local_1c0 + local_1bc;
    local_1c0 = local_1c0 << 4;
  }
  iVar2 = reverse((day2b *)(ulong)local_1bc,0x10,base);
  std::__cxx11::string::~string((string *)&position);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return iVar2;
}

Assistant:

int get_bathroom_code(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		Position position{0,2};
		int code = 0;
		int i = 1;
		while(stream >> line) {
			const char* p = line.c_str();
			while(*p) {
				switch(*p++) {
				case 'U': if(is_valid(position.x, position.y - 1)) --position.y; break;
				case 'R': if(is_valid(position.x + 1, position.y)) ++position.x; break;
				case 'D': if(is_valid(position.x, position.y + 1)) ++position.y; break;
				case 'L': if(is_valid(position.x - 1, position.y)) --position.x; break;
				}
			}
			code += keypad[position.x + position.y * width] * i;
			i *= 16;
		}
		return reverse(code, 16);
	}